

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar.c
# Opt level: O2

int read_header(archive_read *a,archive_entry *entry,char head_type)

{
  ushort *puVar1;
  undefined4 *puVar2;
  undefined1 uVar3;
  byte bVar4;
  short sVar5;
  ushort uVar6;
  uint uVar7;
  uint uVar8;
  void *pvVar9;
  long lVar10;
  ushort uVar11;
  archive_string_conv *sc;
  archive_entry *paVar12;
  short sVar13;
  uint uVar14;
  int iVar15;
  wchar_t wVar16;
  archive_string_conv *paVar17;
  short *psVar18;
  undefined8 uVar19;
  uint *puVar20;
  time_t tVar21;
  void *pvVar22;
  size_t sVar23;
  ulong *puVar24;
  short *psVar25;
  int *piVar26;
  tm *__tp;
  byte bVar27;
  uint uVar28;
  long lVar29;
  long *plVar30;
  char *pcVar31;
  ushort *puVar32;
  ulong uVar33;
  ulong uVar34;
  ushort *puVar35;
  byte bVar36;
  int iVar37;
  ulong uVar38;
  char cVar39;
  undefined1 uVar40;
  uint uVar41;
  ulong uVar42;
  void *pvVar43;
  bool bVar44;
  ushort *local_d0;
  int local_b0;
  time_t local_a8;
  uint local_9c;
  archive_string_conv *local_98;
  ulong local_90;
  archive_string_conv *local_88;
  archive_entry *local_80;
  ulong *local_78;
  long *local_70;
  ulong *local_68;
  long *local_60;
  ulong *local_58;
  long *local_50;
  ulong *local_48;
  ushort *local_40;
  ulong local_38;
  
  pvVar9 = a->format->data;
  paVar17 = *(archive_string_conv **)((long)pvVar9 + 0x4eb0);
  if (paVar17 == (archive_string_conv *)0x0) {
    if (*(int *)((long)pvVar9 + 0x4ea0) == 0) {
      paVar17 = archive_string_default_conversion_for_read(&a->archive);
      *(archive_string_conv **)((long)pvVar9 + 0x4ea8) = paVar17;
      *(undefined4 *)((long)pvVar9 + 0x4ea0) = 1;
    }
    else {
      paVar17 = *(archive_string_conv **)((long)pvVar9 + 0x4ea8);
    }
  }
  psVar18 = (short *)__archive_read_ahead(a,7,(ssize_t *)0x0);
  if (psVar18 == (short *)0x0) {
    return -0x1e;
  }
  sVar5 = *psVar18;
  uVar33 = (ulong)*(ushort *)((long)psVar18 + 5);
  *(uint *)((long)pvVar9 + 0x18) = (uint)*(ushort *)((long)psVar18 + 3);
  if (uVar33 < 0x20) {
    pcVar31 = "Invalid header size";
LAB_0012b04f:
    archive_set_error(&a->archive,0x54,pcVar31);
    return -0x1e;
  }
  local_80 = entry;
  uVar19 = crc32(0,psVar18 + 1,5);
  __archive_read_consume(a,7);
  if ((*(byte *)((long)pvVar9 + 0x18) & 0x10) != 0) {
    pcVar31 = "RAR solid archive support unavailable.";
    goto LAB_0012b04f;
  }
  *(undefined1 *)((long)pvVar9 + 0x17) = 0;
  *(undefined4 *)((long)pvVar9 + 0x40) = 0;
  *(undefined1 (*) [16])((long)pvVar9 + 0x20) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])((long)pvVar9 + 0x30) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])((long)pvVar9 + 0x60) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])((long)pvVar9 + 0x70) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])((long)pvVar9 + 0x80) = (undefined1  [16])0x0;
  *(undefined8 *)((long)pvVar9 + 0x90) = 0;
  local_88 = paVar17;
  puVar20 = (uint *)__archive_read_ahead(a,uVar33 - 7,(ssize_t *)0x0);
  if (puVar20 == (uint *)0x0) {
    return -0x1e;
  }
  sVar13 = crc32(uVar19,puVar20,uVar33 - 7 & 0xffffffff);
  if (sVar5 != sVar13) {
    pcVar31 = "Header CRC error";
    goto LAB_0012b04f;
  }
  uVar28 = *puVar20;
  uVar42 = (ulong)uVar28;
  uVar41 = puVar20[1];
  local_38 = (ulong)(byte)puVar20[2];
  uVar14 = *(uint *)((long)puVar20 + 9);
  iVar15 = *(int *)((long)puVar20 + 0xd);
  uVar6 = *(ushort *)((long)puVar20 + 0x13);
  uVar38 = (ulong)uVar6;
  uVar7 = *(uint *)((long)puVar20 + 0x15);
  *(undefined1 *)((long)pvVar9 + 0x17) = *(undefined1 *)((long)puVar20 + 0x12);
  tVar21 = get_time(iVar15);
  *(time_t *)((long)pvVar9 + 0x30) = tVar21;
  *(ulong *)((long)pvVar9 + 8) = (ulong)uVar14;
  uVar14 = *(uint *)((long)pvVar9 + 0x18);
  if ((uVar14 & 4) != 0) {
    archive_entry_set_is_data_encrypted(local_80,'\x01');
    *(undefined4 *)((long)pvVar9 + 0x4ee8) = 1;
    archive_set_error(&a->archive,0x54,"RAR encryption support unavailable.");
    uVar14 = *(uint *)((long)pvVar9 + 0x18);
  }
  if ((uVar14 >> 8 & 1) == 0) {
    pvVar43 = (void *)((long)puVar20 + 0x19);
    *(ulong *)((long)pvVar9 + 0x20) = uVar42;
    *(ulong *)((long)pvVar9 + 0x28) = (ulong)uVar41;
  }
  else {
    uVar14 = *(uint *)((long)puVar20 + 0x19);
    uVar8 = *(uint *)((long)puVar20 + 0x1d);
    uVar42 = CONCAT44(uVar14,uVar28);
    *(ulong *)((long)pvVar9 + 0x20) = uVar42;
    *(ulong *)((long)pvVar9 + 0x28) = CONCAT44(uVar8,uVar41);
    if ((long)((ulong)(uVar8 | uVar14) << 0x20) < 0) {
      pcVar31 = "Invalid sizes specified.";
      goto LAB_0012b10c;
    }
    pvVar43 = (void *)((long)puVar20 + 0x21);
  }
  *(ulong *)((long)pvVar9 + 0xa0) = uVar42;
  if (head_type == 'z') {
    pvVar22 = __archive_read_ahead(a,(uVar42 + uVar33) - 7,(ssize_t *)0x0);
    if (pvVar22 == (void *)0x0) {
      return -0x1e;
    }
    uVar33 = uVar33 + uVar42;
    lVar29 = (long)pvVar22 + uVar33;
    pvVar43 = (void *)(((long)pvVar43 - (long)puVar20) + (long)pvVar22);
  }
  else {
    lVar29 = (long)puVar20 + uVar33;
  }
  puVar32 = (ushort *)(lVar29 + -7);
  local_d0 = (ushort *)((long)pvVar43 + uVar38);
  if (puVar32 < local_d0) {
    pcVar31 = "Invalid filename size";
    goto LAB_0012b10c;
  }
  psVar18 = *(short **)((long)pvVar9 + 0x48);
  uVar28 = (uint)uVar6 * 2;
  uVar42 = (ulong)uVar28 + 2;
  local_9c = uVar7;
  if (uVar42 <= *(ulong *)((long)pvVar9 + 0x58)) {
LAB_0012b16b:
    memcpy(psVar18,pvVar43,uVar38);
    *(undefined1 *)((long)psVar18 + uVar38) = 0;
    if ((*(byte *)((long)pvVar9 + 0x19) & 2) == 0) {
      while (pcVar31 = strchr((char *)psVar18,0x5c), pcVar31 != (char *)0x0) {
        *pcVar31 = '/';
      }
      local_98 = local_88;
    }
    else {
      sVar23 = strlen((char *)psVar18);
      if (sVar23 != uVar38) {
        uVar14 = (int)sVar23 + 2;
        uVar3 = *(undefined1 *)((long)pvVar43 + (ulong)((int)sVar23 + 1));
        local_90 = (long)psVar18 + 1;
        uVar41 = 0;
        bVar27 = 0;
        bVar36 = 0;
LAB_0012b22d:
        uVar38 = (ulong)(int)uVar41;
        uVar42 = (ulong)uVar41;
        uVar34 = (ulong)uVar14;
        if ((uVar6 <= uVar14) || (uVar28 <= uVar41)) goto LAB_0012b326;
        if (bVar27 == 0) {
          uVar14 = uVar14 + 1;
          bVar36 = *(byte *)((long)pvVar43 + uVar34);
          bVar27 = 8;
        }
        bVar27 = bVar27 - 2;
        uVar34 = (ulong)uVar14;
        switch(bVar36 >> (bVar27 & 0x1f) & 3) {
        case 0:
          *(undefined1 *)((long)psVar18 + uVar42) = 0;
          break;
        case 1:
          *(undefined1 *)((long)psVar18 + uVar42) = uVar3;
          break;
        case 2:
          *(undefined1 *)((long)psVar18 + uVar42) = *(undefined1 *)((long)pvVar43 + uVar34 + 1);
          uVar41 = uVar41 + 2;
          *(undefined1 *)((long)psVar18 + uVar38 + 1) = *(undefined1 *)((long)pvVar43 + uVar34);
          uVar14 = uVar14 + 2;
          goto LAB_0012b22d;
        case 3:
          goto switchD_0012b275_caseD_3;
        }
        uVar14 = uVar14 + 1;
        uVar41 = uVar41 + 2;
        *(undefined1 *)((long)psVar18 + uVar38 + 1) = *(undefined1 *)((long)pvVar43 + uVar34);
        goto LAB_0012b22d;
      }
      local_98 = *(archive_string_conv **)((long)pvVar9 + 0x4eb8);
      if (local_98 == (archive_string_conv *)0x0) {
        local_98 = archive_string_conversion_from_charset(&a->archive,"UTF-8",L'\x01');
        *(archive_string_conv **)((long)pvVar9 + 0x4eb8) = local_98;
        if (local_98 == (archive_string_conv *)0x0) {
          return -0x1e;
        }
      }
      while (pcVar31 = strchr((char *)psVar18,0x5c), pcVar31 != (char *)0x0) {
        *pcVar31 = '/';
      }
    }
    uVar41 = (uint)uVar6;
    goto LAB_0012b345;
  }
  psVar18 = (short *)realloc(psVar18,uVar42);
  if (psVar18 != (short *)0x0) {
    *(short **)((long)pvVar9 + 0x48) = psVar18;
    *(ulong *)((long)pvVar9 + 0x58) = uVar42;
    goto LAB_0012b16b;
  }
LAB_0012b5bd:
  pcVar31 = "Couldn\'t allocate memory.";
LAB_0012b5c4:
  iVar15 = 0xc;
LAB_0012b10e:
  archive_set_error(&a->archive,iVar15,pcVar31);
  return -0x1e;
LAB_0012b326:
  if (uVar28 < uVar41) {
    pcVar31 = "Invalid filename";
  }
  else {
    *(undefined1 *)((long)psVar18 + uVar42) = 0;
    *(undefined1 *)((long)psVar18 + uVar38 + 1) = 0;
    local_98 = *(archive_string_conv **)((long)pvVar9 + 0x4ec0);
    if (local_98 == (archive_string_conv *)0x0) {
      local_98 = archive_string_conversion_from_charset(&a->archive,"UTF-16BE",L'\x01');
      *(archive_string_conv **)((long)pvVar9 + 0x4ec0) = local_98;
      if (local_98 == (archive_string_conv *)0x0) {
        return -0x1e;
      }
    }
    uVar41 = uVar41 + 2;
    for (psVar25 = psVar18; *psVar25 != 0; psVar25 = psVar25 + 1) {
      if (*psVar25 == 0x5c00) {
        *(undefined1 *)((long)psVar25 + 1) = 0x2f;
      }
    }
    local_d0 = (ushort *)((long)pvVar43 + uVar34);
LAB_0012b345:
    pvVar43 = *(void **)((long)pvVar9 + 0x50);
    if (pvVar43 == (void *)0x0) {
      sVar23 = (size_t)(uVar41 + 1);
    }
    else {
      sVar23 = (size_t)(uVar41 + 1);
      iVar15 = bcmp(*(void **)((long)pvVar9 + 0x48),pvVar43,sVar23);
      if (iVar15 == 0) {
        __archive_read_consume(a,uVar33 - 7);
        uVar28 = *(int *)((long)pvVar9 + 0x100) + 1;
        *(uint *)((long)pvVar9 + 0x100) = uVar28;
        if (uVar28 < *(uint *)((long)pvVar9 + 0x104)) {
          pvVar43 = *(void **)((long)pvVar9 + 0xf8);
          uVar38 = (ulong)uVar28;
          if (-1 < *(long *)((long)pvVar43 + uVar38 * 0x18 + 8)) {
            return 0;
          }
LAB_0012b595:
          lVar29 = a->filter->position;
          *(long *)((long)pvVar43 + uVar38 * 0x18 + 8) = lVar29;
          *(long *)((long)pvVar43 + uVar38 * 0x18 + 0x10) = lVar29 + *(long *)((long)pvVar9 + 0x20);
          return 0;
        }
        uVar28 = *(uint *)((long)pvVar9 + 0x104) + 1;
        *(uint *)((long)pvVar9 + 0x104) = uVar28;
        pvVar43 = realloc(*(void **)((long)pvVar9 + 0xf8),(ulong)uVar28 * 0x18);
        *(void **)((long)pvVar9 + 0xf8) = pvVar43;
        if (pvVar43 != (void *)0x0) {
          uVar38 = (ulong)*(uint *)((long)pvVar9 + 0x100);
          *(ulong *)((long)pvVar43 + uVar38 * 0x18) = uVar33;
          puVar2 = (undefined4 *)((long)pvVar43 + uVar38 * 0x18 + 8);
          *puVar2 = 0xffffffff;
          puVar2[1] = 0xffffffff;
          puVar2[2] = 0xffffffff;
          puVar2[3] = 0xffffffff;
          goto LAB_0012b595;
        }
        goto LAB_0012b5bd;
      }
    }
    pvVar43 = realloc(pvVar43,sVar23);
    *(void **)((long)pvVar9 + 0x50) = pvVar43;
    memcpy(pvVar43,*(void **)((long)pvVar9 + 0x48),sVar23);
    free(*(void **)((long)pvVar9 + 0xf8));
    puVar24 = (ulong *)calloc(1,0x18);
    *(ulong **)((long)pvVar9 + 0xf8) = puVar24;
    if (puVar24 == (ulong *)0x0) goto LAB_0012b5bd;
    *puVar24 = uVar33;
    *(undefined4 *)(puVar24 + 1) = 0xffffffff;
    *(undefined4 *)((long)puVar24 + 0xc) = 0xffffffff;
    *(undefined4 *)(puVar24 + 2) = 0xffffffff;
    *(undefined4 *)((long)puVar24 + 0x14) = 0xffffffff;
    *(undefined8 *)((long)pvVar9 + 0x100) = 0x100000000;
    if ((*(uint *)((long)pvVar9 + 0x18) >> 10 & 1) == 0) {
LAB_0012b45e:
      paVar17 = local_88;
      if ((*(uint *)((long)pvVar9 + 0x18) >> 0xc & 1) != 0) {
        puVar35 = local_d0 + 1;
        if (puVar32 < puVar35) goto LAB_0012b4ce;
        local_50 = (long *)((long)pvVar9 + 0x78);
        local_60 = (long *)((long)pvVar9 + 0x68);
        local_70 = (long *)((long)pvVar9 + 0x88);
        local_68 = (ulong *)((long)pvVar9 + 0x70);
        local_58 = (ulong *)((long)pvVar9 + 0x80);
        local_48 = (ulong *)((long)pvVar9 + 0x38);
        local_78 = (ulong *)((long)pvVar9 + 0x90);
        uVar6 = *local_d0;
        for (uVar38 = 3; -1 < (int)uVar38; uVar38 = (ulong)((int)uVar38 - 1)) {
          local_a8 = 0;
          bVar44 = true;
          if ((int)uVar38 == 3) {
            local_a8 = *(long *)((long)pvVar9 + 0x30);
            bVar44 = local_a8 == 0;
          }
          uVar11 = uVar6 >> ((char)uVar38 * '\x04' & 0x1fU);
          if ((uVar11 & 8) != 0) {
            if (bVar44) {
              if (puVar32 < puVar35 + 2) goto LAB_0012b4ce;
              local_a8 = get_time(*(int *)puVar35);
              puVar35 = puVar35 + 2;
            }
            puVar1 = (ushort *)((long)puVar35 + (ulong)(uVar11 & 3));
            if (puVar32 < puVar1) goto LAB_0012b4ce;
            uVar28 = 0;
            for (lVar29 = 0; (uVar11 & 3) != (uint)lVar29; lVar29 = lVar29 + 1) {
              uVar28 = uVar28 >> 8 | (int)*(char *)((long)puVar35 + lVar29) << 0x10;
            }
            local_90 = uVar38;
            local_40 = puVar1;
            __tp = localtime(&local_a8);
            iVar15 = __tp->tm_sec;
            if ((uVar11 & 4) != 0) {
              __tp->tm_sec = iVar15 + 1;
              local_a8 = mktime(__tp);
            }
            iVar37 = (int)local_90;
            plVar30 = (long *)((long)pvVar9 + 0x30);
            puVar24 = local_48;
            if (((iVar37 != 3) && (plVar30 = local_50, puVar24 = local_58, iVar37 != 2)) &&
               (plVar30 = local_60, puVar24 = local_68, iVar37 != 1)) {
              plVar30 = local_70;
              puVar24 = local_78;
            }
            *plVar30 = local_a8;
            *puVar24 = (ulong)(iVar15 + uVar28 / 10000000);
            paVar17 = local_88;
            puVar35 = local_40;
            uVar38 = local_90;
          }
        }
      }
      __archive_read_consume(a,uVar33 - 7);
      lVar29 = a->filter->position;
      lVar10 = *(long *)((long)pvVar9 + 0xf8);
      *(long *)(lVar10 + 8) = lVar29;
      *(long *)(lVar10 + 0x10) = lVar29 + *(long *)((long)pvVar9 + 0x20);
      uVar28 = local_9c;
      if (2 < (uint)local_38 - 3) {
        if (2 < (uint)local_38) {
          pcVar31 = "Unknown file attributes from RAR file\'s host OS";
          goto LAB_0012b10c;
        }
        uVar28 = 0x41ed;
        if ((local_9c & 0x10) == 0) {
          uVar28 = 0x81a4;
        }
      }
      *(uint *)((long)pvVar9 + 0x40) = uVar28;
      *(undefined8 *)((long)pvVar9 + 0x98) = 0;
      *(undefined8 *)((long)pvVar9 + 0x330) = 0;
      *(undefined4 *)((long)pvVar9 + 0xe0) = 0;
      *(undefined4 *)((long)pvVar9 + 0x4ed0) = 0;
      *(undefined8 *)((long)pvVar9 + 0x4ed8) = 0;
      *(undefined8 *)((long)pvVar9 + 0xe8) = 0;
      *(undefined1 *)((long)pvVar9 + 0xe5) = 0;
      *(undefined1 (*) [16])((long)pvVar9 + 0xa8) = (undefined1  [16])0x0;
      *(undefined1 (*) [16])((long)pvVar9 + 0xb8) = (undefined1  [16])0x0;
      *(undefined1 *)((long)pvVar9 + 200) = 1;
      *(undefined1 *)((long)pvVar9 + 0x36b) = 0;
      *(undefined1 *)((long)pvVar9 + 0x368) = 1;
      free(*(void **)((long)pvVar9 + 0xd8));
      *(undefined8 *)((long)pvVar9 + 0xd8) = 0;
      *(undefined8 *)((long)pvVar9 + 0xcc) = 0x2000000000000;
      memset((void *)((long)pvVar9 + 0x188),0,0x194);
      Ppmd7_Free((CPpmd7 *)((long)pvVar9 + 0x370),&g_szalloc);
      paVar12 = local_80;
      *(undefined2 *)((long)pvVar9 + 0x369) = 0;
      if (head_type == 'z') {
        return 0;
      }
      archive_entry_set_mtime
                (local_80,*(time_t *)((long)pvVar9 + 0x30),*(long *)((long)pvVar9 + 0x38));
      archive_entry_set_ctime
                (paVar12,*(time_t *)((long)pvVar9 + 0x78),*(long *)((long)pvVar9 + 0x80));
      archive_entry_set_atime
                (paVar12,*(time_t *)((long)pvVar9 + 0x68),*(long *)((long)pvVar9 + 0x70));
      archive_entry_set_size(paVar12,*(int64_t *)((long)pvVar9 + 0x28));
      archive_entry_set_mode(paVar12,*(mode_t *)((long)pvVar9 + 0x40));
      sc = local_98;
      wVar16 = _archive_entry_copy_pathname_l(paVar12,(char *)psVar18,(ulong)uVar41,local_98);
      if (wVar16 == L'\0') {
        iVar15 = 0;
      }
      else {
        piVar26 = __errno_location();
        if (*piVar26 == 0xc) {
          archive_set_error(&a->archive,0xc,"Can\'t allocate memory for Pathname");
          return -0x1e;
        }
        iVar15 = -0x14;
        pcVar31 = archive_string_conversion_charset_name(sc);
        archive_set_error(&a->archive,0x54,"Pathname cannot be converted from %s to current locale."
                          ,pcVar31);
      }
      paVar12 = local_80;
      local_b0 = iVar15;
      if ((*(uint *)((long)pvVar9 + 0x40) & 0xf000) != 0xa000) goto LAB_0012b9fe;
      *(undefined8 *)((long)pvVar9 + 0xa0) = 0;
      local_b0 = 0;
      archive_entry_set_size(local_80,0);
      pvVar43 = a->format->data;
      pcVar31 = (char *)rar_read_ahead(a,*(size_t *)((long)pvVar43 + 0x20),(ssize_t *)0x0);
      if (pcVar31 == (char *)0x0) {
        return -0x1e;
      }
      wVar16 = _archive_entry_copy_symlink_l
                         (paVar12,pcVar31,*(size_t *)((long)pvVar43 + 0x20),paVar17);
      if (wVar16 != L'\0') {
        piVar26 = __errno_location();
        if (*piVar26 == 0xc) {
          pcVar31 = "Can\'t allocate memory for link";
          goto LAB_0012b5c4;
        }
        pcVar31 = archive_string_conversion_charset_name(paVar17);
        archive_set_error(&a->archive,0x54,"link cannot be converted from %s to current locale.",
                          pcVar31);
        local_b0 = -0x14;
      }
      __archive_read_consume(a,*(int64_t *)((long)pvVar43 + 0x20));
      if (iVar15 < local_b0) {
        local_b0 = iVar15;
      }
LAB_0012b9fe:
      if (*(long *)((long)pvVar9 + 0xa0) == 0) {
        *(undefined1 *)((long)pvVar9 + 0xe5) = 1;
        return local_b0;
      }
      return local_b0;
    }
    if (local_d0 + 4 <= puVar32) {
      *(undefined8 *)((long)pvVar9 + 0x60) = *(undefined8 *)local_d0;
      local_d0 = local_d0 + 4;
      goto LAB_0012b45e;
    }
LAB_0012b4ce:
    pcVar31 = "Invalid header size";
  }
LAB_0012b10c:
  iVar15 = 0x54;
  goto LAB_0012b10e;
switchD_0012b275_caseD_3:
  bVar4 = *(byte *)((long)pvVar43 + uVar34);
  if ((char)bVar4 < '\0') {
    uVar14 = uVar14 + 2;
    cVar39 = *(char *)((long)pvVar43 + uVar34 + 1);
    uVar40 = uVar3;
  }
  else {
    cVar39 = '\0';
    uVar14 = (uint)(uVar34 + 1);
    uVar40 = 0;
  }
  lVar29 = 0;
  for (; ((byte)((bVar4 & 0x7f) + 2) != (char)lVar29 && (uVar41 < uVar28)); uVar41 = uVar41 + 2) {
    *(undefined1 *)(local_90 + uVar38 + -1 + lVar29 * 2) = uVar40;
    *(char *)(local_90 + uVar38 + lVar29 * 2) =
         *(char *)((long)pvVar43 + (ulong)((int)(uVar38 >> 1) + (int)lVar29 & 0x7fffffff)) + cVar39;
    lVar29 = lVar29 + 1;
  }
  goto LAB_0012b22d;
}

Assistant:

static int
read_header(struct archive_read *a, struct archive_entry *entry,
            char head_type)
{
  const void *h;
  const char *p, *endp;
  struct rar *rar;
  struct rar_header rar_header;
  struct rar_file_header file_header;
  int64_t header_size;
  unsigned filename_size, end;
  char *filename;
  char *strp;
  char packed_size[8];
  char unp_size[8];
  int ttime;
  struct archive_string_conv *sconv, *fn_sconv;
  unsigned long crc32_val;
  int ret = (ARCHIVE_OK), ret2;

  rar = (struct rar *)(a->format->data);

  /* Setup a string conversion object for non-rar-unicode filenames. */
  sconv = rar->opt_sconv;
  if (sconv == NULL) {
    if (!rar->init_default_conversion) {
      rar->sconv_default =
          archive_string_default_conversion_for_read(
            &(a->archive));
      rar->init_default_conversion = 1;
    }
    sconv = rar->sconv_default;
  }


  if ((h = __archive_read_ahead(a, 7, NULL)) == NULL)
    return (ARCHIVE_FATAL);
  p = h;
  memcpy(&rar_header, p, sizeof(rar_header));
  rar->file_flags = archive_le16dec(rar_header.flags);
  header_size = archive_le16dec(rar_header.size);
  if (header_size < (int64_t)sizeof(file_header) + 7) {
    archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
      "Invalid header size");
    return (ARCHIVE_FATAL);
  }
  crc32_val = crc32(0, (const unsigned char *)p + 2, 7 - 2);
  __archive_read_consume(a, 7);

  if (!(rar->file_flags & FHD_SOLID))
  {
    rar->compression_method = 0;
    rar->packed_size = 0;
    rar->unp_size = 0;
    rar->mtime = 0;
    rar->ctime = 0;
    rar->atime = 0;
    rar->arctime = 0;
    rar->mode = 0;
    memset(&rar->salt, 0, sizeof(rar->salt));
    rar->atime = 0;
    rar->ansec = 0;
    rar->ctime = 0;
    rar->cnsec = 0;
    rar->mtime = 0;
    rar->mnsec = 0;
    rar->arctime = 0;
    rar->arcnsec = 0;
  }
  else
  {
    archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                      "RAR solid archive support unavailable.");
    return (ARCHIVE_FATAL);
  }

  if ((h = __archive_read_ahead(a, (size_t)header_size - 7, NULL)) == NULL)
    return (ARCHIVE_FATAL);

  /* File Header CRC check. */
  crc32_val = crc32(crc32_val, h, (unsigned)(header_size - 7));
  if ((crc32_val & 0xffff) != archive_le16dec(rar_header.crc)) {
    archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
      "Header CRC error");
    return (ARCHIVE_FATAL);
  }
  /* If no CRC error, Go on parsing File Header. */
  p = h;
  endp = p + header_size - 7;
  memcpy(&file_header, p, sizeof(file_header));
  p += sizeof(file_header);

  rar->compression_method = file_header.method;

  ttime = archive_le32dec(file_header.file_time);
  rar->mtime = get_time(ttime);

  rar->file_crc = archive_le32dec(file_header.file_crc);

  if (rar->file_flags & FHD_PASSWORD)
  {
	archive_entry_set_is_data_encrypted(entry, 1);
	rar->has_encrypted_entries = 1;
    archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                      "RAR encryption support unavailable.");
    /* Since it is only the data part itself that is encrypted we can at least
       extract information about the currently processed entry and don't need
       to return ARCHIVE_FATAL here. */
    /*return (ARCHIVE_FATAL);*/
  }

  if (rar->file_flags & FHD_LARGE)
  {
    memcpy(packed_size, file_header.pack_size, 4);
    memcpy(packed_size + 4, p, 4); /* High pack size */
    p += 4;
    memcpy(unp_size, file_header.unp_size, 4);
    memcpy(unp_size + 4, p, 4); /* High unpack size */
    p += 4;
    rar->packed_size = archive_le64dec(&packed_size);
    rar->unp_size = archive_le64dec(&unp_size);
  }
  else
  {
    rar->packed_size = archive_le32dec(file_header.pack_size);
    rar->unp_size = archive_le32dec(file_header.unp_size);
  }

  if (rar->packed_size < 0 || rar->unp_size < 0)
  {
    archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                      "Invalid sizes specified.");
    return (ARCHIVE_FATAL);
  }

  rar->bytes_remaining = rar->packed_size;

  /* TODO: RARv3 subblocks contain comments. For now the complete block is
   * consumed at the end.
   */
  if (head_type == NEWSUB_HEAD) {
    size_t distance = p - (const char *)h;
    header_size += rar->packed_size;
    /* Make sure we have the extended data. */
    if ((h = __archive_read_ahead(a, (size_t)header_size - 7, NULL)) == NULL)
        return (ARCHIVE_FATAL);
    p = h;
    endp = p + header_size - 7;
    p += distance;
  }

  filename_size = archive_le16dec(file_header.name_size);
  if (p + filename_size > endp) {
    archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
      "Invalid filename size");
    return (ARCHIVE_FATAL);
  }
  if (rar->filename_allocated < filename_size * 2 + 2) {
    char *newptr;
    size_t newsize = filename_size * 2 + 2;
    newptr = realloc(rar->filename, newsize);
    if (newptr == NULL) {
      archive_set_error(&a->archive, ENOMEM,
                        "Couldn't allocate memory.");
      return (ARCHIVE_FATAL);
    }
    rar->filename = newptr;
    rar->filename_allocated = newsize;
  }
  filename = rar->filename;
  memcpy(filename, p, filename_size);
  filename[filename_size] = '\0';
  if (rar->file_flags & FHD_UNICODE)
  {
    if (filename_size != strlen(filename))
    {
      unsigned char highbyte, flagbits, flagbyte;
      unsigned fn_end, offset;

      end = filename_size;
      fn_end = filename_size * 2;
      filename_size = 0;
      offset = (unsigned)strlen(filename) + 1;
      highbyte = *(p + offset++);
      flagbits = 0;
      flagbyte = 0;
      while (offset < end && filename_size < fn_end)
      {
        if (!flagbits)
        {
          flagbyte = *(p + offset++);
          flagbits = 8;
        }

        flagbits -= 2;
        switch((flagbyte >> flagbits) & 3)
        {
          case 0:
            filename[filename_size++] = '\0';
            filename[filename_size++] = *(p + offset++);
            break;
          case 1:
            filename[filename_size++] = highbyte;
            filename[filename_size++] = *(p + offset++);
            break;
          case 2:
            filename[filename_size++] = *(p + offset + 1);
            filename[filename_size++] = *(p + offset);
            offset += 2;
            break;
          case 3:
          {
            char extra, high;
            uint8_t length = *(p + offset++);

            if (length & 0x80) {
              extra = *(p + offset++);
              high = (char)highbyte;
            } else
              extra = high = 0;
            length = (length & 0x7f) + 2;
            while (length && filename_size < fn_end) {
              unsigned cp = filename_size >> 1;
              filename[filename_size++] = high;
              filename[filename_size++] = p[cp] + extra;
              length--;
            }
          }
          break;
        }
      }
      if (filename_size > fn_end) {
        archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
          "Invalid filename");
        return (ARCHIVE_FATAL);
      }
      filename[filename_size++] = '\0';
      filename[filename_size++] = '\0';

      /* Decoded unicode form is UTF-16BE, so we have to update a string
       * conversion object for it. */
      if (rar->sconv_utf16be == NULL) {
        rar->sconv_utf16be = archive_string_conversion_from_charset(
           &a->archive, "UTF-16BE", 1);
        if (rar->sconv_utf16be == NULL)
          return (ARCHIVE_FATAL);
      }
      fn_sconv = rar->sconv_utf16be;

      strp = filename;
      while (memcmp(strp, "\x00\x00", 2))
      {
        if (!memcmp(strp, "\x00\\", 2))
          *(strp + 1) = '/';
        strp += 2;
      }
      p += offset;
    } else {
      /*
       * If FHD_UNICODE is set but no unicode data, this file name form
       * is UTF-8, so we have to update a string conversion object for
       * it accordingly.
       */
      if (rar->sconv_utf8 == NULL) {
        rar->sconv_utf8 = archive_string_conversion_from_charset(
           &a->archive, "UTF-8", 1);
        if (rar->sconv_utf8 == NULL)
          return (ARCHIVE_FATAL);
      }
      fn_sconv = rar->sconv_utf8;
      while ((strp = strchr(filename, '\\')) != NULL)
        *strp = '/';
      p += filename_size;
    }
  }
  else
  {
    fn_sconv = sconv;
    while ((strp = strchr(filename, '\\')) != NULL)
      *strp = '/';
    p += filename_size;
  }

  /* Split file in multivolume RAR. No more need to process header. */
  if (rar->filename_save &&
    !memcmp(rar->filename, rar->filename_save, filename_size + 1))
  {
    __archive_read_consume(a, header_size - 7);
    rar->cursor++;
    if (rar->cursor >= rar->nodes)
    {
      rar->nodes++;
      if ((rar->dbo =
        realloc(rar->dbo, sizeof(*rar->dbo) * rar->nodes)) == NULL)
      {
        archive_set_error(&a->archive, ENOMEM, "Couldn't allocate memory.");
        return (ARCHIVE_FATAL);
      }
      rar->dbo[rar->cursor].header_size = header_size;
      rar->dbo[rar->cursor].start_offset = -1;
      rar->dbo[rar->cursor].end_offset = -1;
    }
    if (rar->dbo[rar->cursor].start_offset < 0)
    {
      rar->dbo[rar->cursor].start_offset = a->filter->position;
      rar->dbo[rar->cursor].end_offset = rar->dbo[rar->cursor].start_offset +
        rar->packed_size;
    }
    return ret;
  }

  rar->filename_save = (char*)realloc(rar->filename_save,
                                      filename_size + 1);
  memcpy(rar->filename_save, rar->filename, filename_size + 1);

  /* Set info for seeking */
  free(rar->dbo);
  if ((rar->dbo = calloc(1, sizeof(*rar->dbo))) == NULL)
  {
    archive_set_error(&a->archive, ENOMEM, "Couldn't allocate memory.");
    return (ARCHIVE_FATAL);
  }
  rar->dbo[0].header_size = header_size;
  rar->dbo[0].start_offset = -1;
  rar->dbo[0].end_offset = -1;
  rar->cursor = 0;
  rar->nodes = 1;

  if (rar->file_flags & FHD_SALT)
  {
    if (p + 8 > endp) {
      archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
        "Invalid header size");
      return (ARCHIVE_FATAL);
    }
    memcpy(rar->salt, p, 8);
    p += 8;
  }

  if (rar->file_flags & FHD_EXTTIME) {
    if (read_exttime(p, rar, endp) < 0) {
      archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
        "Invalid header size");
      return (ARCHIVE_FATAL);
    }
  }

  __archive_read_consume(a, header_size - 7);
  rar->dbo[0].start_offset = a->filter->position;
  rar->dbo[0].end_offset = rar->dbo[0].start_offset + rar->packed_size;

  switch(file_header.host_os)
  {
  case OS_MSDOS:
  case OS_OS2:
  case OS_WIN32:
    rar->mode = archive_le32dec(file_header.file_attr);
    if (rar->mode & FILE_ATTRIBUTE_DIRECTORY)
      rar->mode = AE_IFDIR | S_IXUSR | S_IXGRP | S_IXOTH;
    else
      rar->mode = AE_IFREG;
    rar->mode |= S_IRUSR | S_IWUSR | S_IRGRP | S_IROTH;
    break;

  case OS_UNIX:
  case OS_MAC_OS:
  case OS_BEOS:
    rar->mode = archive_le32dec(file_header.file_attr);
    break;

  default:
    archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                      "Unknown file attributes from RAR file's host OS");
    return (ARCHIVE_FATAL);
  }

  rar->bytes_uncopied = rar->bytes_unconsumed = 0;
  rar->lzss.position = rar->offset = 0;
  rar->offset_seek = 0;
  rar->dictionary_size = 0;
  rar->offset_outgoing = 0;
  rar->br.cache_avail = 0;
  rar->br.avail_in = 0;
  rar->crc_calculated = 0;
  rar->entry_eof = 0;
  rar->valid = 1;
  rar->is_ppmd_block = 0;
  rar->start_new_table = 1;
  free(rar->unp_buffer);
  rar->unp_buffer = NULL;
  rar->unp_offset = 0;
  rar->unp_buffer_size = UNP_BUFFER_SIZE;
  memset(rar->lengthtable, 0, sizeof(rar->lengthtable));
  __archive_ppmd7_functions.Ppmd7_Free(&rar->ppmd7_context, &g_szalloc);
  rar->ppmd_valid = rar->ppmd_eod = 0;

  /* Don't set any archive entries for non-file header types */
  if (head_type == NEWSUB_HEAD)
    return ret;

  archive_entry_set_mtime(entry, rar->mtime, rar->mnsec);
  archive_entry_set_ctime(entry, rar->ctime, rar->cnsec);
  archive_entry_set_atime(entry, rar->atime, rar->ansec);
  archive_entry_set_size(entry, rar->unp_size);
  archive_entry_set_mode(entry, rar->mode);

  if (archive_entry_copy_pathname_l(entry, filename, filename_size, fn_sconv))
  {
    if (errno == ENOMEM)
    {
      archive_set_error(&a->archive, ENOMEM,
                        "Can't allocate memory for Pathname");
      return (ARCHIVE_FATAL);
    }
    archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                      "Pathname cannot be converted from %s to current locale.",
                      archive_string_conversion_charset_name(fn_sconv));
    ret = (ARCHIVE_WARN);
  }

  if (((rar->mode) & AE_IFMT) == AE_IFLNK)
  {
    /* Make sure a symbolic-link file does not have its body. */
    rar->bytes_remaining = 0;
    archive_entry_set_size(entry, 0);

    /* Read a symbolic-link name. */
    if ((ret2 = read_symlink_stored(a, entry, sconv)) < (ARCHIVE_WARN))
      return ret2;
    if (ret > ret2)
      ret = ret2;
  }

  if (rar->bytes_remaining == 0)
    rar->entry_eof = 1;

  return ret;
}